

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

int areBlanks(xmlParserCtxtPtr ctxt,xmlChar *str,int len,int blank_chars)

{
  int iVar1;
  xmlNodePtr node;
  xmlNodePtr lastChild;
  int ret;
  int i;
  int blank_chars_local;
  int len_local;
  xmlChar *str_local;
  xmlParserCtxtPtr ctxt_local;
  
  if (ctxt->sax->ignorableWhitespace == ctxt->sax->characters) {
    ctxt_local._4_4_ = 0;
  }
  else if (((ctxt->space == (int *)0x0) || (*ctxt->space == 1)) || (*ctxt->space == -2)) {
    ctxt_local._4_4_ = 0;
  }
  else {
    if (blank_chars == 0) {
      for (lastChild._4_4_ = 0; lastChild._4_4_ < len; lastChild._4_4_ = lastChild._4_4_ + 1) {
        if (((str[lastChild._4_4_] != ' ') &&
            ((str[lastChild._4_4_] < 9 || (10 < str[lastChild._4_4_])))) &&
           (str[lastChild._4_4_] != '\r')) {
          return 0;
        }
      }
    }
    if (ctxt->node == (xmlNodePtr)0x0) {
      ctxt_local._4_4_ = 0;
    }
    else {
      if (ctxt->myDoc != (xmlDocPtr)0x0) {
        iVar1 = xmlIsMixedElement(ctxt->myDoc,ctxt->node->name);
        if (iVar1 == 0) {
          return 1;
        }
        if (iVar1 == 1) {
          return 0;
        }
      }
      if ((*ctxt->input->cur == '<') || (*ctxt->input->cur == '\r')) {
        if ((ctxt->node->children == (_xmlNode *)0x0) &&
           ((*ctxt->input->cur == '<' && (ctxt->input->cur[1] == '/')))) {
          ctxt_local._4_4_ = 0;
        }
        else {
          node = xmlGetLastChild(ctxt->node);
          if (node == (xmlNodePtr)0x0) {
            if ((ctxt->node->type != XML_ELEMENT_NODE) && (ctxt->node->content != (xmlChar *)0x0)) {
              return 0;
            }
          }
          else {
            iVar1 = xmlNodeIsText(node);
            if (iVar1 != 0) {
              return 0;
            }
            if ((ctxt->node->children != (_xmlNode *)0x0) &&
               (iVar1 = xmlNodeIsText(ctxt->node->children), iVar1 != 0)) {
              return 0;
            }
          }
          ctxt_local._4_4_ = 1;
        }
      }
      else {
        ctxt_local._4_4_ = 0;
      }
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

static int areBlanks(htmlParserCtxtPtr ctxt, const xmlChar *str, int len) {
    unsigned int i;
    int j;
    xmlNodePtr lastChild;
    xmlDtdPtr dtd;

    for (j = 0;j < len;j++)
        if (!(IS_BLANK_CH(str[j]))) return(0);

    if (CUR == 0) return(1);
    if (CUR != '<') return(0);
    if (ctxt->name == NULL)
	return(1);
    if (xmlStrEqual(ctxt->name, BAD_CAST"html"))
	return(1);
    if (xmlStrEqual(ctxt->name, BAD_CAST"head"))
	return(1);

    /* Only strip CDATA children of the body tag for strict HTML DTDs */
    if (xmlStrEqual(ctxt->name, BAD_CAST "body") && ctxt->myDoc != NULL) {
        dtd = xmlGetIntSubset(ctxt->myDoc);
        if (dtd != NULL && dtd->ExternalID != NULL) {
            if (!xmlStrcasecmp(dtd->ExternalID, BAD_CAST "-//W3C//DTD HTML 4.01//EN") ||
                    !xmlStrcasecmp(dtd->ExternalID, BAD_CAST "-//W3C//DTD HTML 4//EN"))
                return(1);
        }
    }

    if (ctxt->node == NULL) return(0);
    lastChild = xmlGetLastChild(ctxt->node);
    while ((lastChild) && (lastChild->type == XML_COMMENT_NODE))
	lastChild = lastChild->prev;
    if (lastChild == NULL) {
        if ((ctxt->node->type != XML_ELEMENT_NODE) &&
            (ctxt->node->content != NULL)) return(0);
	/* keep ws in constructs like ...<b> </b>...
	   for all tags "b" allowing PCDATA */
	for ( i = 0; i < sizeof(allowPCData)/sizeof(allowPCData[0]); i++ ) {
	    if ( xmlStrEqual(ctxt->name, BAD_CAST allowPCData[i]) ) {
		return(0);
	    }
	}
    } else if (xmlNodeIsText(lastChild)) {
        return(0);
    } else {
	/* keep ws in constructs like <p><b>xy</b> <i>z</i><p>
	   for all tags "p" allowing PCDATA */
	for ( i = 0; i < sizeof(allowPCData)/sizeof(allowPCData[0]); i++ ) {
	    if ( xmlStrEqual(lastChild->name, BAD_CAST allowPCData[i]) ) {
		return(0);
	    }
	}
    }
    return(1);
}